

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnetcfg.cpp
# Opt level: O0

void vmnet_check_storagesrv_stat(char *stat)

{
  int iVar1;
  void *in_RDI;
  uint in_stack_00000008;
  vm_obj_id_t in_stack_0000000c;
  CVmRun *in_stack_00000010;
  
  iVar1 = memcmp(in_RDI,"OK ",3);
  if (iVar1 == 0) {
    free(in_RDI);
  }
  else {
    CVmRun::push_string(in_stack_00000010,(char *)CONCAT44(in_stack_0000000c,in_stack_00000008));
    free(in_RDI);
    CVmRun::throw_new_rtesub(in_stack_00000010,in_stack_0000000c,in_stack_00000008,stat._4_4_);
  }
  return;
}

Assistant:

void vmnet_check_storagesrv_stat(VMG_ char *stat)
{
    /* if it's not "OK", throw an error */
    if (memcmp(stat, "OK ", 3) != 0)
    {
        /* 
         *   Error.  Push the error code/message text string as the argument
         *   to the runtime error constructor, then discard our copy of the
         *   buffer.  
         */
        G_interpreter->push_string(vmg_ stat);
        t3free(stat);

        /* throw a StorageServerError */
        G_interpreter->throw_new_rtesub(
            vmg_ G_predef->storage_server_error, 1,
            VMERR_STORAGE_SERVER_ERR);
    }
    else
    {
        /* success - discard the message text */
        t3free(stat);
    }
}